

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O3

Tools * Tools::getInstance(void)

{
  Tools *this;
  
  if (p_instance == (Tools *)0x0) {
    this = (Tools *)operator_new(0x70);
    Tools(this);
    p_instance = this;
  }
  return p_instance;
}

Assistant:

static Tools *getInstance() {
        if (!p_instance)
            p_instance = new Tools();
        return p_instance;
    }